

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_encode_cblk(opj_t1_t *t1,opj_tcd_cblk_enc_t *cblk,int orient,int compno,int level,int qmfbid
                   ,double stepsize,int cblksty,int numcomps,int mct,opj_tcd_tile_t *tile)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  opj_t1_t *t1_00;
  int *piVar5;
  long *in_RSI;
  long in_RDI;
  double dVar6;
  uint in_stack_00000008;
  undefined4 in_stack_00000018;
  long in_stack_00000020;
  opj_tcd_pass_t *pass_1;
  int correction;
  opj_tcd_pass_t *pass;
  int tmp;
  double tempwmsedec;
  char type;
  int max;
  int i;
  int nmsedec;
  int passtype;
  int bpno;
  int passno;
  opj_mqc_t *mqc;
  double cumwmsedec;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_9c;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  char cVar7;
  opj_t1_t *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int iVar8;
  int in_stack_ffffffffffffff98;
  int local_50;
  int local_4c;
  int iVar9;
  int iVar10;
  opj_mqc_t *mqc_00;
  opj_mqc_t *t1_01;
  
  t1_01 = (opj_mqc_t *)0x0;
  mqc_00 = *(opj_mqc_t **)(in_RDI + 8);
  local_50 = 0;
  for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x28) * *(int *)(in_RDI + 0x2c);
      local_4c = local_4c + 1) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0x18) + (long)local_4c * 4);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    local_50 = int_max(local_50,iVar2);
  }
  if (local_50 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = int_floorlog2(local_50);
    iVar2 = iVar2 + -5;
  }
  *(int *)(in_RSI + 5) = iVar2;
  iVar3 = (int)in_RSI[5] + -1;
  iVar9 = 2;
  mqc_resetstates(mqc_00);
  mqc_setstate(mqc_00,0x12,0,0x2e);
  mqc_setstate(mqc_00,0x11,0,3);
  mqc_setstate(mqc_00,0,0,4);
  mqc_init_enc(mqc_00,(uchar *)*in_RSI);
  iVar10 = 0;
  while (-1 < iVar3) {
    t1_00 = (opj_t1_t *)(in_RSI[2] + (long)iVar10 * 0x18);
    iVar8 = 3;
    uVar1 = in_stack_ffffffffffffff78 & 0xffffff;
    if ((iVar3 < (int)in_RSI[5] + -4) && (uVar1 = in_stack_ffffffffffffff78 & 0xffffff, iVar9 < 2))
    {
      uVar1 = CONCAT13((in_stack_00000008 & 1) != 0,(int3)in_stack_ffffffffffffff78);
    }
    in_stack_ffffffffffffff78 = uVar1;
    cVar7 = (char)(in_stack_ffffffffffffff78 >> 0x18);
    iVar4 = iVar9;
    if (iVar9 == 0) {
      t1_enc_sigpass(t1_00,3,in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80,
                     (char)((uint)iVar2 >> 0x18),in_stack_ffffffffffffff78);
    }
    else if (iVar9 == 1) {
      t1_enc_refpass(in_stack_ffffffffffffff80,iVar2,(int *)CONCAT44(1,in_stack_ffffffffffffff70),
                     (char)((uint)in_stack_ffffffffffffff6c >> 0x18),in_stack_ffffffffffffff68);
    }
    else if ((iVar9 == 2) &&
            (t1_enc_clnpass((opj_t1_t *)t1_01,(int)((ulong)mqc_00 >> 0x20),(int)mqc_00,
                            (int *)CONCAT44(iVar10,iVar3),2), (in_stack_00000008 & 0x20) != 0)) {
      mqc_segmark_enc((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    in_stack_ffffffffffffff50 = in_stack_00000018;
    dVar6 = t1_getwmsedec((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                          (int)in_stack_ffffffffffffff80,iVar2,in_stack_ffffffffffffff78,iVar9,
                          in_stack_ffffffffffffff70,
                          (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (int)t1_00,in_stack_ffffffffffffff98);
    t1_01 = (opj_mqc_t *)(dVar6 + (double)t1_01);
    *(double *)(in_stack_00000020 + 0x28) = dVar6 + *(double *)(in_stack_00000020 + 0x28);
    if (((in_stack_00000008 & 4) == 0) || ((iVar4 == 2 && (iVar3 + -1 < 0)))) {
      if ((((iVar3 < (int)in_RSI[5] + -4) && (0 < iVar4)) ||
          ((iVar3 == (int)in_RSI[5] + -4 && (iVar4 == 2)))) && ((in_stack_00000008 & 1) != 0)) {
        if (cVar7 == '\x01') {
          mqc_flush((opj_mqc_t *)0x161657);
        }
        else {
          mqc_flush((opj_mqc_t *)0x16166e);
        }
        iVar8 = 1;
        *(undefined4 *)&t1_00->raw = 1;
      }
      else {
        *(undefined4 *)&t1_00->raw = 0;
      }
    }
    else {
      if (cVar7 == '\x01') {
        mqc_flush((opj_mqc_t *)0x1615c7);
      }
      else {
        mqc_flush((opj_mqc_t *)0x1615de);
      }
      iVar8 = 1;
      *(undefined4 *)&t1_00->raw = 1;
    }
    iVar9 = iVar4 + 1;
    if (iVar9 == 3) {
      iVar9 = 0;
      iVar3 = iVar3 + -1;
    }
    if ((*(int *)&t1_00->raw != 0) && (0 < iVar3)) {
      uVar1 = in_stack_ffffffffffffff70 & 0xffffff;
      if ((iVar3 < (int)in_RSI[5] + -4) && (uVar1 = in_stack_ffffffffffffff70 & 0xffffff, iVar9 < 2)
         ) {
        uVar1 = CONCAT13((in_stack_00000008 & 1) != 0,(int3)in_stack_ffffffffffffff70);
      }
      in_stack_ffffffffffffff70 = uVar1;
      if ((char)(in_stack_ffffffffffffff70 >> 0x18) == '\0') {
        mqc_restart_init_enc(mqc_00);
      }
      else {
        mqc_bypass_init_enc(mqc_00);
      }
    }
    t1_00->mqc = t1_01;
    iVar4 = mqc_numbytes(mqc_00);
    *(int *)&t1_00->cinfo = iVar4 + iVar8;
    if ((in_stack_00000008 & 2) != 0) {
      mqc_reset_enc((opj_mqc_t *)0x16178e);
    }
    iVar10 = iVar10 + 1;
  }
  if ((in_stack_00000008 & 0x10) == 0) {
    if ((in_stack_00000008 & 1) == 0) {
      mqc_flush((opj_mqc_t *)0x1617da);
    }
  }
  else {
    mqc_erterm_enc((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  *(int *)(in_RSI + 7) = iVar10;
  for (iVar2 = 0; iVar2 < (int)in_RSI[7]; iVar2 = iVar2 + 1) {
    piVar5 = (int *)(in_RSI[2] + (long)iVar2 * 0x18);
    iVar3 = *piVar5;
    iVar9 = mqc_numbytes(mqc_00);
    if (iVar9 < iVar3) {
      iVar3 = mqc_numbytes(mqc_00);
      *piVar5 = iVar3;
    }
    if ((1 < *piVar5) && (*(char *)(*in_RSI + (long)(*piVar5 + -1)) == -1)) {
      *piVar5 = *piVar5 + -1;
    }
    if (iVar2 == 0) {
      local_9c = 0;
    }
    else {
      local_9c = *(int *)(in_RSI[2] + (long)(iVar2 + -1) * 0x18);
    }
    piVar5[5] = *piVar5 - local_9c;
  }
  return;
}

Assistant:

static void t1_encode_cblk(
		opj_t1_t *t1,
		opj_tcd_cblk_enc_t* cblk,
		int orient,
		int compno,
		int level,
		int qmfbid,
		double stepsize,
		int cblksty,
		int numcomps,
		int mct,
		opj_tcd_tile_t * tile)
{
	double cumwmsedec = 0.0;

	opj_mqc_t *mqc = t1->mqc;	/* MQC component */

	int passno, bpno, passtype;
	int nmsedec = 0;
	int i, max;
	char type = T1_TYPE_MQ;
	double tempwmsedec;

	max = 0;
	for (i = 0; i < t1->w * t1->h; ++i) {
		int tmp = abs(t1->data[i]);
		max = int_max(max, tmp);
	}

	cblk->numbps = max ? (int_floorlog2(max) + 1) - T1_NMSEDEC_FRACBITS : 0;
	
	bpno = cblk->numbps - 1;
	passtype = 2;
	
	mqc_resetstates(mqc);
	mqc_setstate(mqc, T1_CTXNO_UNI, 0, 46);
	mqc_setstate(mqc, T1_CTXNO_AGG, 0, 3);
	mqc_setstate(mqc, T1_CTXNO_ZC, 0, 4);
	mqc_init_enc(mqc, cblk->data);
	
	for (passno = 0; bpno >= 0; ++passno) {
		opj_tcd_pass_t *pass = &cblk->passes[passno];
		int correction = 3;
		type = ((bpno < (cblk->numbps - 4)) && (passtype < 2) && (cblksty & J2K_CCP_CBLKSTY_LAZY)) ? T1_TYPE_RAW : T1_TYPE_MQ;
		
		switch (passtype) {
			case 0:
				t1_enc_sigpass(t1, bpno, orient, &nmsedec, type, cblksty);
				break;
			case 1:
				t1_enc_refpass(t1, bpno, &nmsedec, type, cblksty);
				break;
			case 2:
				t1_enc_clnpass(t1, bpno, orient, &nmsedec, cblksty);
				/* code switch SEGMARK (i.e. SEGSYM) */
				if (cblksty & J2K_CCP_CBLKSTY_SEGSYM)
					mqc_segmark_enc(mqc);
				break;
		}
		
		/* fixed_quality */
		tempwmsedec = t1_getwmsedec(nmsedec, compno, level, orient, bpno, qmfbid, stepsize, numcomps, mct);
		cumwmsedec += tempwmsedec;
		tile->distotile += tempwmsedec;
		
		/* Code switch "RESTART" (i.e. TERMALL) */
		if ((cblksty & J2K_CCP_CBLKSTY_TERMALL)	&& !((passtype == 2) && (bpno - 1 < 0))) {
			if (type == T1_TYPE_RAW) {
				mqc_flush(mqc);
				correction = 1;
				/* correction = mqc_bypass_flush_enc(); */
			} else {			/* correction = mqc_restart_enc(); */
				mqc_flush(mqc);
				correction = 1;
			}
			pass->term = 1;
		} else {
			if (((bpno < (cblk->numbps - 4) && (passtype > 0)) 
				|| ((bpno == (cblk->numbps - 4)) && (passtype == 2))) && (cblksty & J2K_CCP_CBLKSTY_LAZY)) {
				if (type == T1_TYPE_RAW) {
					mqc_flush(mqc);
					correction = 1;
					/* correction = mqc_bypass_flush_enc(); */
				} else {		/* correction = mqc_restart_enc(); */
					mqc_flush(mqc);
					correction = 1;
				}
				pass->term = 1;
			} else {
				pass->term = 0;
			}
		}
		
		if (++passtype == 3) {
			passtype = 0;
			bpno--;
		}
		
		if (pass->term && bpno > 0) {
			type = ((bpno < (cblk->numbps - 4)) && (passtype < 2) && (cblksty & J2K_CCP_CBLKSTY_LAZY)) ? T1_TYPE_RAW : T1_TYPE_MQ;
			if (type == T1_TYPE_RAW)
				mqc_bypass_init_enc(mqc);
			else
				mqc_restart_init_enc(mqc);
		}
		
		pass->distortiondec = cumwmsedec;
		pass->rate = mqc_numbytes(mqc) + correction;	/* FIXME */
		
		/* Code-switch "RESET" */
		if (cblksty & J2K_CCP_CBLKSTY_RESET)
			mqc_reset_enc(mqc);
	}
	
	/* Code switch "ERTERM" (i.e. PTERM) */
	if (cblksty & J2K_CCP_CBLKSTY_PTERM)
		mqc_erterm_enc(mqc);
	else /* Default coding */ if (!(cblksty & J2K_CCP_CBLKSTY_LAZY))
		mqc_flush(mqc);
	
	cblk->totalpasses = passno;

	for (passno = 0; passno<cblk->totalpasses; passno++) {
		opj_tcd_pass_t *pass = &cblk->passes[passno];
		if (pass->rate > mqc_numbytes(mqc))
			pass->rate = mqc_numbytes(mqc);
		/*Preventing generation of FF as last data byte of a pass*/
		if((pass->rate>1) && (cblk->data[pass->rate - 1] == 0xFF)){
			pass->rate--;
		}
		pass->len = pass->rate - (passno == 0 ? 0 : cblk->passes[passno - 1].rate);		
	}
}